

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O1

void D_DoServerInfoChange(BYTE **stream,bool singlebit)

{
  BYTE *__src;
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FBoolCVar *this;
  undefined4 extraout_var;
  undefined8 *puVar5;
  undefined4 extraout_var_00;
  uint uVar6;
  int i;
  long lVar7;
  ulong __n;
  char name [64];
  UCVarValue local_88;
  ECVarType local_7c;
  char local_78 [72];
  
  uVar2 = ReadByte(stream);
  __n = (ulong)(uVar2 & 0x3f);
  if ((uVar2 & 0x3f) == 0) {
    return;
  }
  __src = *stream;
  memcpy(local_78,__src,__n);
  *stream = __src + __n;
  local_78[__n] = '\0';
  local_7c = (int)uVar2 >> 6;
  this = (FBoolCVar *)FindCVar(local_78,(FBaseCVar **)0x0);
  if (singlebit) {
    if (this == (FBoolCVar *)0x0) goto switchD_0037143e_default;
    uVar2 = (*(this->super_FBaseCVar)._vptr_FBaseCVar[5])(this,&local_7c);
    if (local_7c == CVAR_Int) {
      uVar3 = ReadByte(stream);
      uVar6 = 1 << ((byte)uVar3 & 0x1f);
      if ((uVar3 & 0x20) == 0) {
        local_88.Int = ~uVar6 & uVar2;
      }
      else {
        local_88.Int = uVar6 | uVar2;
      }
      local_88._4_4_ = extraout_var;
      goto switchD_0037143e_default;
    }
  }
  else {
    switch(local_7c) {
    case CVAR_Bool:
      iVar4 = ReadByte(stream);
      local_88.Bool = iVar4 != 0;
      break;
    case CVAR_Int:
      local_88.Int = ReadLong(stream);
      break;
    case CVAR_Float:
      local_88.Float = ReadFloat(stream);
      break;
    case CVAR_String:
      local_88.String = ReadString(stream);
    }
switchD_0037143e_default:
    if (this != (FBoolCVar *)0x0) {
      FBaseCVar::ForceSet((FBaseCVar *)this,local_88,local_7c,false);
    }
    if ((local_7c == CVAR_String) && (local_88.String != (char *)0x0)) {
      operator_delete__(local_88.String);
    }
    if (this == &teamplay) {
      lVar7 = 0;
      do {
        if (playeringame[lVar7] == true) {
          puVar1 = (undefined8 *)
                   ((ulong)(((&DAT_017e5e98)[lVar7 * 0xa8] - 1 & 0x203) * 0x18) +
                   (&DAT_017e5e88)[lVar7 * 0x54]);
          do {
            puVar5 = puVar1;
            puVar1 = (undefined8 *)*puVar5;
          } while (*(int *)(puVar5 + 1) != 0x203);
          UpdateTeam((int)lVar7,*(int *)(puVar5[2] + 0x28),true);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
    }
    if (this != (FBoolCVar *)0x0) {
      iVar4 = (*(this->super_FBaseCVar)._vptr_FBaseCVar[4])(this,3);
      lVar7 = CONCAT44(extraout_var_00,iVar4);
      goto LAB_00371533;
    }
  }
  lVar7 = 0;
LAB_00371533:
  if ((lVar7 != 0) && (netgame == true)) {
    Printf("%s changed to %s\n",local_78,lVar7);
  }
  return;
}

Assistant:

void D_DoServerInfoChange (BYTE **stream, bool singlebit)
{
	const char *value;
	char name[64];
	int len;
	int type;

	len = ReadByte (stream);
	type = len >> 6;
	len &= 0x3f;
	if (len == 0)
		return;
	memcpy (name, *stream, len);
	*stream += len;
	name[len] = 0;

	if ( (value = SetServerVar (name, (ECVarType)type, stream, singlebit)) && netgame)
	{
		Printf ("%s changed to %s\n", name, value);
	}
}